

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.cpp
# Opt level: O2

int __thiscall luna::Function::AddConstValue(Function *this,Value *v)

{
  std::vector<luna::Value,_std::allocator<luna::Value>_>::push_back(&this->const_values_,v);
  return (int)((ulong)((long)(this->const_values_).
                             super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)(this->const_values_).
                            super__Vector_base<luna::Value,_std::allocator<luna::Value>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 4) + -1;
}

Assistant:

int Function::AddConstValue(const Value &v)
    {
        const_values_.push_back(v);
        return const_values_.size() - 1;
    }